

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_invocable.h
# Opt level: O0

void __thiscall
absl::lts_20250127::internal_any_invocable::
CoreImpl<false,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>>::
InitializeStorage<std::__cxx11::string(*&)(std::basic_string_view<char,std::char_traits<char>>),std::__cxx11::string(&)(std::basic_string_view<char,std::char_traits<char>>),void>
          (CoreImpl<false,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>>
           *this,_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_basic_string_view<char,_std::char_traits<char>_>
                 *args)

{
  _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_basic_string_view<char,_std::char_traits<char>_>
  *args_local;
  CoreImpl<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *this_local;
  
  *(_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_basic_string_view<char,_std::char_traits<char>_>
    **)this = args;
  *(code **)(this + 0x18) =
       LocalInvoker<false,std::__cxx11::string,std::__cxx11::string(*&)(std::basic_string_view<char,std::char_traits<char>>),std::basic_string_view<char,std::char_traits<char>>>
  ;
  InitializeLocalManager<std::__cxx11::string(*)(std::basic_string_view<char,std::char_traits<char>>),void>
            (this);
  return;
}

Assistant:

void InitializeStorage(Args&&... args) {
    using RawT = RemoveCVRef<QualTRef>;
    ::new (static_cast<void*>(&state_.storage))
        RawT(std::forward<Args>(args)...);

    invoker_ = LocalInvoker<SigIsNoexcept, ReturnType, QualTRef, P...>;
    // We can simplify our manager if we know the type is trivially copyable.
    InitializeLocalManager<RawT>();
  }